

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable arkodeSymplecticMcLachlan3(void)

{
  double dVar1;
  double __x;
  ARKodeSPRKTable sprk_table;
  sunrealtype z;
  sunrealtype y;
  sunrealtype w;
  int in_stack_ffffffffffffff9c;
  double local_60;
  double local_50;
  double local_40;
  double local_38;
  ARKodeSPRKTable local_8;
  
  local_8 = ARKodeSPRKTable_Alloc(in_stack_ffffffffffffff9c);
  if (local_8 == (ARKodeSPRKTable)0x0) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    local_8->q = 3;
    local_8->stages = 3;
    dVar1 = sqrt(3.0);
    dVar1 = pow(0.07407407407407407 - 1.0 / (dVar1 * 9.0),0.3333333333333333);
    dVar1 = 1.0 / (-dVar1 * 9.0) + -0.6666666666666666 + -dVar1;
    __x = (dVar1 * dVar1 + 1.0) / 4.0;
    if (0.0 < __x) {
      local_38 = sqrt(__x);
    }
    else {
      local_38 = 0.0;
    }
    if (0.0 < (1.0 / (__x * 9.0) - dVar1 / 2.0) + local_38) {
      if (0.0 < __x) {
        local_50 = sqrt(__x);
      }
      else {
        local_50 = 0.0;
      }
      local_40 = sqrt((1.0 / (__x * 9.0) - dVar1 / 2.0) + local_50);
    }
    else {
      local_40 = 0.0;
    }
    if (0.0 < __x) {
      local_60 = sqrt(__x);
    }
    else {
      local_60 = 0.0;
    }
    *local_8->a = local_40 - 1.0 / (local_60 * 3.0);
    local_8->a[1] = 0.25 / *local_8->a - *local_8->a / 2.0;
    local_8->a[2] = (1.0 - *local_8->a) - local_8->a[1];
    *local_8->ahat = local_8->a[2];
    local_8->ahat[1] = local_8->a[1];
    local_8->ahat[2] = *local_8->a;
  }
  return local_8;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticMcLachlan3(void)
{
  sunrealtype w              = SUN_RCONST(0.0);
  sunrealtype y              = SUN_RCONST(0.0);
  sunrealtype z              = SUN_RCONST(0.0);
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(3);
  if (!sprk_table) { return NULL; }

  sprk_table->q      = 3;
  sprk_table->stages = 3;

  z = -SUNRpowerR((SUN_RCONST(2.0) / SUN_RCONST(27.0)) -
                    SUN_RCONST(1.0) /
                      (SUN_RCONST(9.0) * SUNRsqrt(SUN_RCONST(3.0))),
                  SUN_RCONST(1.0) / SUN_RCONST(3.0));
  w = -SUN_RCONST(2.0) / SUN_RCONST(3.0) +
      SUN_RCONST(1.0) / (SUN_RCONST(9.0) * z) + z;
  y                = (SUN_RCONST(1.0) + w * w) / SUN_RCONST(4.0);
  sprk_table->a[0] = SUNRsqrt(SUN_RCONST(1.0) / (SUN_RCONST(9.0) * y) -
                              w / SUN_RCONST(2.0) + SUNRsqrt(y)) -
                     SUN_RCONST(1.0) / (SUN_RCONST(3.0) * SUNRsqrt(y));
  sprk_table->a[1] = SUN_RCONST(0.25) / sprk_table->a[0] -
                     sprk_table->a[0] / SUN_RCONST(2.0);
  sprk_table->a[2]    = SUN_RCONST(1.0) - sprk_table->a[0] - sprk_table->a[1];
  sprk_table->ahat[0] = sprk_table->a[2];
  sprk_table->ahat[1] = sprk_table->a[1];
  sprk_table->ahat[2] = sprk_table->a[0];
  return sprk_table;
}